

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O0

void __thiscall
FIX::SocketMonitor::processRead(SocketMonitor *this,Strategy *strategy,socket_handle socket_fd)

{
  socket_handle local_24;
  socket_handle local_20;
  socket_handle socket;
  int s;
  socket_handle socket_fd_local;
  Strategy *strategy_local;
  SocketMonitor *this_local;
  
  local_20 = socket_fd;
  socket = socket_fd;
  _s = strategy;
  strategy_local = (Strategy *)this;
  if (socket_fd == this->m_interrupt) {
    local_24 = 0;
    recv(socket_fd,&local_24,4,0);
    addWrite(this,local_24);
  }
  else {
    (*strategy->_vptr_Strategy[3])(strategy,this,(ulong)(uint)socket_fd);
  }
  return;
}

Assistant:

void SocketMonitor::processRead(Strategy &strategy, socket_handle socket_fd) {
  int s = socket_fd;
  if (s == m_interrupt) {
    socket_handle socket = 0;
    recv(s, (char *)&socket, sizeof(socket), 0);
    addWrite(socket);
  } else {
    strategy.onEvent(*this, s);
  }
}